

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int expression_statement(void)

{
  int iVar1;
  int extraout_EAX;
  node_t pvVar2;
  socklen_t *__addr_len;
  sockaddr *in_RSI;
  int unaff_retaddr;
  node_t n;
  undefined4 local_4;
  
  pvVar2 = expression();
  if (pvVar2 == (node_t)0x0) {
    iVar1 = accept(0x3b,in_RSI,__addr_len);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    iVar1 = expect(unaff_retaddr);
    if (iVar1 == 0) {
      sync();
      local_4 = extraout_EAX;
    }
    else {
      ast_add_node((node_t)0x10630d);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int expression_statement()
{
    node_t n;

    if ((n = expression()))
    {
        if (expect(';'))
        {
            ast_add_node(n);
            return 1;
        }
        else
            return sync(";");
    }
    else if (accept(';'))
        return 1;
    
    return 0;
}